

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O0

void __thiscall RTIMU::RTIMU(RTIMU *this,RTIMUSettings *settings)

{
  int iVar1;
  RTFusionKalman4 *this_00;
  RTFusionRTQF *this_01;
  RTFusion *this_02;
  char *pcVar2;
  int local_1c;
  int i;
  RTIMUSettings *settings_local;
  RTIMU *this_local;
  
  this->_vptr_RTIMU = (_func_int **)&PTR__RTIMU_001345d8;
  RTIMU_DATA::RTIMU_DATA(&this->m_imuData);
  RTVector3::RTVector3(&this->m_previousAccel);
  RTVector3::RTVector3(&this->m_compassAverage);
  this->m_settings = settings;
  this->m_compassCalibrationMode = false;
  this->m_accelCalibrationMode = false;
  this->m_runtimeMagCalValid = false;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    this->m_runtimeMagCalMax[local_1c] = -1000.0;
    this->m_runtimeMagCalMin[local_1c] = 1000.0;
  }
  iVar1 = this->m_settings->m_fusionType;
  if (iVar1 == 1) {
    this_00 = (RTFusionKalman4 *)operator_new(0x2e8);
    RTFusionKalman4::RTFusionKalman4(this_00);
    this->m_fusion = (RTFusion *)this_00;
  }
  else if (iVar1 == 2) {
    this_01 = (RTFusionRTQF *)operator_new(0xf0);
    RTFusionRTQF::RTFusionRTQF(this_01);
    this->m_fusion = (RTFusion *)this_01;
  }
  else {
    this_02 = (RTFusion *)operator_new(0xb8);
    RTFusion::RTFusion(this_02);
    this->m_fusion = this_02;
  }
  pcVar2 = RTFusion::fusionName(this->m_settings->m_fusionType);
  printf("Using fusion algorithm %s\n",pcVar2);
  fflush(_stdout);
  return;
}

Assistant:

RTIMU::RTIMU(RTIMUSettings *settings)
{
    m_settings = settings;

    m_compassCalibrationMode = false;
    m_accelCalibrationMode = false;

    m_runtimeMagCalValid = false;

    for (int i = 0; i < 3; i++) {
        m_runtimeMagCalMax[i] = -1000;
        m_runtimeMagCalMin[i] = 1000;
    }

    switch (m_settings->m_fusionType) {
    case RTFUSION_TYPE_KALMANSTATE4:
        m_fusion = new RTFusionKalman4();
        break;

    case RTFUSION_TYPE_RTQF:
        m_fusion = new RTFusionRTQF();
        break;

    default:
        m_fusion = new RTFusion();
        break;
    }
    HAL_INFO1("Using fusion algorithm %s\n", RTFusion::fusionName(m_settings->m_fusionType));
}